

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

void __thiscall
tcu::CompressedTexture::setStorage
          (CompressedTexture *this,CompressedTexFormat format,int width,int height,int depth)

{
  int iVar1;
  int iVar2;
  deInt32 dVar3;
  deInt32 dVar4;
  deInt32 dVar5;
  undefined1 local_2c [4];
  int blockSize;
  IVec3 blockPixelSize;
  int depth_local;
  int height_local;
  int width_local;
  CompressedTexFormat format_local;
  CompressedTexture *this_local;
  
  this->m_format = format;
  this->m_width = width;
  this->m_height = height;
  this->m_depth = depth;
  blockPixelSize.m_data[1] = depth;
  blockPixelSize.m_data[2] = height;
  if (this->m_format == COMPRESSEDTEXFORMAT_LAST) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_data,0);
  }
  else {
    getBlockPixelSize((tcu *)local_2c,this->m_format);
    iVar1 = getBlockSize(this->m_format);
    dVar5 = this->m_width;
    iVar2 = Vector<int,_3>::x((Vector<int,_3> *)local_2c);
    dVar3 = deDivRoundUp32(dVar5,iVar2);
    dVar5 = this->m_height;
    iVar2 = Vector<int,_3>::y((Vector<int,_3> *)local_2c);
    dVar4 = deDivRoundUp32(dVar5,iVar2);
    dVar5 = this->m_depth;
    iVar2 = Vector<int,_3>::z((Vector<int,_3> *)local_2c);
    dVar5 = deDivRoundUp32(dVar5,iVar2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_data,(long)(dVar3 * dVar4 * dVar5 * iVar1));
  }
  return;
}

Assistant:

void CompressedTexture::setStorage (CompressedTexFormat format, int width, int height, int depth)
{
	m_format	= format;
	m_width		= width;
	m_height	= height;
	m_depth		= depth;

	if (m_format != COMPRESSEDTEXFORMAT_LAST)
	{
		const IVec3	blockPixelSize	= getBlockPixelSize(m_format);
		const int	blockSize		= getBlockSize(m_format);

		m_data.resize(deDivRoundUp32(m_width, blockPixelSize.x()) * deDivRoundUp32(m_height, blockPixelSize.y()) * deDivRoundUp32(m_depth, blockPixelSize.z()) * blockSize);
	}
	else
	{
		DE_ASSERT(m_format == COMPRESSEDTEXFORMAT_LAST);
		DE_ASSERT(m_width == 0 && m_height == 0 && m_depth == 0);
		m_data.resize(0);
	}
}